

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDeformer.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::BlendShapeChannel::BlendShapeChannel
          (BlendShapeChannel *this,uint64_t id,Element *element,Document *doc,string *name)

{
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *this_00
  ;
  string *this_01;
  bool bVar1;
  Scope *pSVar2;
  Element *pEVar3;
  Token *t;
  uint64_t dest;
  size_type __n;
  reference ppCVar4;
  float fVar5;
  ShapeGeometry *local_f0;
  ShapeGeometry *sg;
  Connection *con;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *__range2;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
  *local_b0;
  vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_> *conns;
  string local_a0;
  Element *local_80;
  Element *FullWeights;
  string local_70;
  Element *local_50;
  Element *DeformPercent;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  BlendShapeChannel *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  Deformer::Deformer(&this->super_Deformer,id,element,doc,name);
  (this->super_Deformer).super_Object._vptr_Object = (_func_int **)&PTR__BlendShapeChannel_00ecb4e8;
  std::vector<float,_std::allocator<float>_>::vector(&this->fullWeights);
  std::
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>::
  vector(&this->shapeGeometries);
  pSVar2 = GetRequiredScope((Element *)doc_local);
  local_38 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"DeformPercent",(allocator<char> *)((long)&FullWeights + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&FullWeights + 7));
  local_50 = pEVar3;
  if (pEVar3 != (Element *)0x0) {
    t = GetRequiredToken(pEVar3,0);
    fVar5 = ParseTokenAsFloat(t);
    this->percent = fVar5;
  }
  pSVar2 = local_38;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"FullWeights",(allocator<char> *)((long)&conns + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&conns + 7));
  local_80 = pEVar3;
  if (pEVar3 != (Element *)0x0) {
    ParseVectorDataArray(&this->fullWeights,pEVar3);
  }
  this_01 = name_local;
  dest = FBX::Object::ID((Object *)this);
  Document::GetConnectionsByDestinationSequenced
            ((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2,(Document *)this_01,dest,"Geometry");
  local_b0 = (vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
              *)&__range2;
  __n = std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        size(local_b0);
  std::
  vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>::
  reserve(&this->shapeGeometries,__n);
  this_00 = local_b0;
  __end2 = std::
           vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           ::begin(local_b0);
  con = (Connection *)
        std::
        vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
        end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
                                     *)&con), bVar1) {
    ppCVar4 = __gnu_cxx::
              __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
              ::operator*(&__end2);
    sg = (ShapeGeometry *)*ppCVar4;
    local_f0 = Util::ProcessSimpleConnection<Assimp::FBX::ShapeGeometry>
                         ((Connection *)sg,false,"Shape -> BlendShapeChannel",(Element *)doc_local,
                          (char **)0x0);
    if (local_f0 != (ShapeGeometry *)0x0) {
      std::
      vector<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
      ::push_back(&this->shapeGeometries,&local_f0);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::FBX::Connection_*const_*,_std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>_>
    ::operator++(&__end2);
  }
  std::vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>::
  ~vector((vector<const_Assimp::FBX::Connection_*,_std::allocator<const_Assimp::FBX::Connection_*>_>
           *)&__range2);
  return;
}

Assistant:

BlendShapeChannel::BlendShapeChannel(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : Deformer(id, element, doc, name)
{
    const Scope& sc = GetRequiredScope(element);
    const Element* const DeformPercent = sc["DeformPercent"];
    if (DeformPercent) {
        percent = ParseTokenAsFloat(GetRequiredToken(*DeformPercent, 0));
    }
    const Element* const FullWeights = sc["FullWeights"];
    if (FullWeights) {
        ParseVectorDataArray(fullWeights, *FullWeights);
    }
    const std::vector<const Connection*>& conns = doc.GetConnectionsByDestinationSequenced(ID(), "Geometry");
    shapeGeometries.reserve(conns.size());
    for (const Connection* con : conns) {
        const ShapeGeometry* const sg = ProcessSimpleConnection<ShapeGeometry>(*con, false, "Shape -> BlendShapeChannel", element);
        if (sg) {
            shapeGeometries.push_back(sg);
            continue;
        }
    }
}